

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_set_register_tests.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::price::pixie::
SubjectSetRegisterTest_test_retrieving_after_no_change_returns_null_Test::TestBody
          (SubjectSetRegisterTest_test_retrieving_after_no_change_returns_null_Test *this)

{
  bool bVar1;
  char *in_R9;
  AssertionResult gtest_ar_;
  SubjectSetRegister subject_register;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c8;
  AssertHelper local_1c0;
  internal local_1b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1b0;
  undefined1 local_1a8 [104];
  bool local_140;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_138;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  SubjectSetRegister local_108 [48];
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  local_d8 [48];
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
  local_a8 [48];
  _Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> local_78;
  
  bidfx_public_api::price::pixie::SubjectSetRegister::SubjectSetRegister(local_108);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  local_1b8[0] = (internal)(local_140 ^ 1);
  local_1b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)local_1a8);
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,local_1b8,
               (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x245,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (local_1c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_1c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1c8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_120,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_108,&local_120,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_120);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset(&local_78)
  ;
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  local_1b8[0] = (internal)(local_140 ^ 1);
  local_1b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)local_1a8);
  if (local_1b8[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,local_1b8,
               (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x249,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (local_1c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_1c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1c8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  bidfx_public_api::price::subject::Subject::Subject((Subject *)&local_138,(Subject *)SS_SUBJECT0);
  bidfx_public_api::price::pixie::SubjectSetRegister::Register(local_108,&local_138,0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_138);
  bidfx_public_api::price::pixie::SubjectSetRegister::NextSubscriptionSync();
  local_1b8[0] = (internal)(local_140 ^ 1);
  local_1b0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  std::_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync>::_M_reset
            ((_Optional_payload_base<bidfx_public_api::price::pixie::SubscriptionSync> *)local_1a8);
  if (local_140 != false) {
    testing::Message::Message((Message *)&local_1c8);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_1a8,local_1b8,
               (AssertionResult *)"subject_register.NextSubscriptionSync()","true","false",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_1c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/price/provider/pixie/subject_set_register_tests.cpp"
               ,0x24c,(char *)local_1a8._0_8_);
    testing::internal::AssertHelper::operator=(&local_1c0,(Message *)&local_1c8);
    testing::internal::AssertHelper::~AssertHelper(&local_1c0);
    if ((undefined1 *)local_1a8._0_8_ != local_1a8 + 0x10) {
      operator_delete((void *)local_1a8._0_8_,local_1a8._16_8_ + 1);
    }
    if (local_1c8.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_1c8.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_1c8.ptr_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_1b0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>,_std::_Select1st<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<bidfx_public_api::price::pixie::EditionData>_>_>_>
  ::~_Rb_tree(local_a8);
  std::
  _Rb_tree<bidfx_public_api::price::subject::Subject,_std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>,_std::_Select1st<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>,_std::less<bidfx_public_api::price::subject::Subject>,_std::allocator<std::pair<const_bidfx_public_api::price::subject::Subject,_bidfx_public_api::price::pixie::SubjectState>_>_>
  ::~_Rb_tree(local_d8);
  return;
}

Assistant:

TEST(SubjectSetRegisterTest, test_retrieving_after_no_change_returns_null)
{
    SubjectSetRegister subject_register = SubjectSetRegister();
    EXPECT_FALSE(subject_register.NextSubscriptionSync());

    subject_register.Register(SS_SUBJECT0, false);
    subject_register.NextSubscriptionSync();
    EXPECT_FALSE(subject_register.NextSubscriptionSync());

    subject_register.Register(SS_SUBJECT0, false);
    EXPECT_FALSE(subject_register.NextSubscriptionSync());
}